

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O0

void matrix_mul_f(MATRIX_f *m1,MATRIX_f *m2,MATRIX_f *out)

{
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  int j;
  int i;
  MATRIX_f temp;
  int local_50;
  int local_4c;
  undefined1 local_48 [48];
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDI == in_RDX) {
    memcpy(local_48,in_RDI,0x30);
    local_8 = local_48;
  }
  else {
    local_8 = in_RDI;
    if (in_RSI == in_RDX) {
      memcpy(local_48,in_RSI,0x30);
      local_10 = local_48;
    }
  }
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
      *(float *)(local_18 + (long)local_50 * 4 + (long)local_4c * 0xc) =
           *(float *)(local_8 + (long)local_50 * 4 + 0x18) *
           *(float *)(local_10 + (long)local_4c * 0xc + 8) +
           *(float *)(local_8 + (long)local_50 * 4) * *(float *)(local_10 + (long)local_4c * 0xc) +
           *(float *)(local_8 + (long)local_50 * 4 + 0xc) *
           *(float *)(local_10 + (long)local_4c * 0xc + 4);
    }
    *(float *)(local_18 + (long)local_4c * 4 + 0x24) =
         *(float *)(local_8 + 0x2c) * *(float *)(local_10 + (long)local_4c * 0xc + 8) +
         *(float *)(local_8 + 0x24) * *(float *)(local_10 + (long)local_4c * 0xc) +
         *(float *)(local_8 + 0x28) * *(float *)(local_10 + (long)local_4c * 0xc + 4) +
         *(float *)(local_10 + (long)local_4c * 4 + 0x24);
  }
  return;
}

Assistant:

void matrix_mul_f(const MATRIX_f *m1, const MATRIX_f *m2, MATRIX_f *out)
{
   MATRIX_f temp;
   int i, j;

   if (m1 == out) {
      temp = *m1;
      m1 = &temp;
   }
   else if (m2 == out) {
      temp = *m2;
      m2 = &temp;
   }

   for (i=0; i<3; i++) {
      for (j=0; j<3; j++) {
	 out->v[i][j] = (m1->v[0][j] * m2->v[i][0]) +
			(m1->v[1][j] * m2->v[i][1]) +
			(m1->v[2][j] * m2->v[i][2]);
      }

      out->t[i] = (m1->t[0] * m2->v[i][0]) +
		  (m1->t[1] * m2->v[i][1]) +
		  (m1->t[2] * m2->v[i][2]) +
		  m2->t[i];
   }
}